

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O1

void __thiscall OpenMD::Electrostatic::ReciprocalSpaceSum(Electrostatic *this,RealType *pot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  pointer ppAVar16;
  pointer pdVar17;
  pointer pdVar18;
  pointer pdVar19;
  pointer pdVar20;
  pointer pEVar21;
  Snapshot *pSVar22;
  size_type sVar23;
  uint i;
  int iVar24;
  long lVar25;
  void *__s;
  Molecule *pMVar26;
  Atom *pAVar27;
  pointer ppAVar28;
  value_type_conflict2 *pvVar29;
  double *pdVar30;
  uint i_3;
  pointer *ppdVar31;
  uint i_5;
  int iVar32;
  value_type_conflict2 *pvVar33;
  value_type_conflict2 *pvVar34;
  uint i_10;
  long lVar35;
  long lVar36;
  pointer pdVar37;
  double (*__return_storage_ptr__) [3];
  byte bVar38;
  double tmp;
  double dVar39;
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  value_type_conflict2 vVar43;
  double dVar44;
  MoleculeIterator mi;
  Vector3d kVec;
  Vector<double,_3U> tmp_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ems;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  els;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  enc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  emc;
  vector<double,_std::allocator<double>_> skr;
  vector<double,_std::allocator<double>_> ckr;
  Mat3x3d Q;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ens;
  vector<double,_std::allocator<double>_> qks;
  vector<double,_std::allocator<double>_> qkc;
  vector<double,_std::allocator<double>_> dks;
  vector<double,_std::allocator<double>_> dkc;
  vector<double,_std::allocator<double>_> cks;
  vector<double,_std::allocator<double>_> ckc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elc;
  Vector3d D;
  Vector3d Qk;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> qxk;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> dxk;
  vector<double,_std::allocator<double>_> slm;
  vector<double,_std::allocator<double>_> clm;
  Vector3d tt;
  Vector3d r;
  RectMatrix<double,_3U,_3U> result_1;
  Mat3x3d hmat;
  MoleculeIterator local_4f8;
  pointer local_4f0;
  double local_4e8;
  pointer local_4e0;
  double local_4d8 [4];
  double local_4b8;
  pointer local_4b0;
  pointer local_4a8;
  void *local_4a0;
  double local_498;
  pointer local_490;
  double local_488;
  Molecule *pMStack_480;
  double local_478;
  double local_468 [9];
  Molecule *local_420;
  pointer local_418;
  pointer local_410;
  pointer local_408;
  pointer local_400;
  pointer local_3f8;
  pointer local_3f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_3e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_3c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_3a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_388;
  vector<double,_std::allocator<double>_> local_368;
  vector<double,_std::allocator<double>_> local_350;
  value_type_conflict2 local_338;
  pointer pvStack_330;
  double local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2e8;
  size_type local_2c8;
  Electrostatic *local_2c0;
  vector<double,_std::allocator<double>_> local_2b8;
  vector<double,_std::allocator<double>_> local_2a0;
  vector<double,_std::allocator<double>_> local_288;
  vector<double,_std::allocator<double>_> local_270;
  vector<double,_std::allocator<double>_> local_258;
  vector<double,_std::allocator<double>_> local_240;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_228;
  double local_208 [4];
  double local_1e8 [4];
  double local_1c8;
  pointer pvStack_1c0;
  double local_1b8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_1a8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_190;
  vector<double,_std::allocator<double>_> local_178;
  vector<double,_std::allocator<double>_> local_160;
  double local_148 [4];
  Vector3d local_128;
  double *local_108;
  double local_100;
  double local_f8;
  double local_f0;
  value_type_conflict2 local_e8;
  pointer pvStack_e0;
  undefined8 local_d8;
  value_type_conflict2 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  Mat3x3d local_78;
  
  bVar38 = 0;
  local_108 = pot;
  Snapshot::getHmat(&local_78,this->info_->sman_->currentSnapshot_);
  local_338 = 0.0;
  pvStack_330 = (pointer)0x0;
  local_328 = 0.0;
  lVar25 = 0;
  do {
    *(undefined8 *)((long)&local_338 + lVar25) =
         *(undefined8 *)
          ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar25 * 4);
    lVar25 = lVar25 + 8;
  } while (lVar25 != 0x18);
  local_1b8 = local_328;
  local_1c8 = local_338;
  pvStack_1c0 = pvStack_330;
  lVar25 = 0;
  local_4e8 = local_338;
  vVar43 = local_338;
  do {
    dVar41 = (&local_1c8)[lVar25];
    if ((&local_1c8)[lVar25] <= vVar43) {
      dVar41 = vVar43;
    }
    vVar43 = dVar41;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 3);
  __s = operator_new(0x1a0);
  memset(__s,0,0x1a0);
  dVar44 = local_1b8;
  dVar41 = this->dampingAlpha_;
  if (1e-12 <= dVar41) {
    local_4e0 = pvStack_1c0;
    local_228.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_388.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_388.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3c8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3c8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2e8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8 = (size_type)this->info_->nAtoms_;
    local_4a0 = __s;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_228,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_388,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_3a8,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_3c8,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_3e8,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_2e8,9);
    sVar23 = local_2c8;
    local_100 = 6.283185307179586 / local_4e8;
    local_f8 = 6.283185307179586 / (double)local_4e0;
    local_f0 = 6.283185307179586 / dVar44;
    local_4b8 = 6.283185307179586 / vVar43;
    local_4e8 = 6.283185307179586 / (local_4e8 * (double)local_4e0 * dVar44);
    local_498 = -0.25 / (dVar41 * dVar41);
    lVar25 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_228.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar25),sVar23);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_388.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar25),sVar23);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_3a8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar25),sVar23);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_3c8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar25),sVar23);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_3e8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar25),sVar23);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_2e8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar25),sVar23);
      lVar25 = lVar25 + 0x18;
    } while (lVar25 != 0xd8);
    local_338 = 0.0;
    pvStack_330 = (pointer)0x0;
    local_328 = 0.0;
    lVar25 = 0;
    auVar42 = _DAT_002972b0;
    do {
      if (SUB164(auVar42 ^ _DAT_002972c0,4) == -0x80000000 &&
          SUB164(auVar42 ^ _DAT_002972c0,0) < -0x7ffffffd) {
        (&local_338)[lVar25] = 6.283185307179586;
        (&pvStack_330)[lVar25] = (pointer)0x401921fb54442d18;
      }
      lVar25 = lVar25 + 2;
      lVar36 = auVar42._8_8_;
      auVar42._0_8_ = auVar42._0_8_ + 2;
      auVar42._8_8_ = lVar36 + 2;
    } while (lVar25 != 4);
    local_d8 = local_328;
    local_e8 = local_338;
    pvStack_e0 = pvStack_330;
    lVar25 = 0;
    do {
      (&local_e8)[lVar25] = (&local_e8)[lVar25] / (&local_1c8)[lVar25];
      lVar25 = lVar25 + 1;
    } while (lVar25 != 3);
    local_4f8._M_node = (_Base_ptr)0x0;
    local_128.super_Vector<double,_3U>.data_[2] = 0.0;
    local_128.super_Vector<double,_3U>.data_[0] = 0.0;
    local_128.super_Vector<double,_3U>.data_[1] = 0.0;
    local_148[2] = 0.0;
    local_148[0] = 0.0;
    local_148[1] = 0.0;
    pMVar26 = SimInfo::beginMolecule(this->info_,&local_4f8);
    local_2c0 = this;
    while (pMVar26 != (Molecule *)0x0) {
      ppAVar28 = (pMVar26->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_420 = pMVar26;
      if (ppAVar28 ==
          (pMVar26->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pAVar27 = (Atom *)0x0;
      }
      else {
        pAVar27 = *ppAVar28;
      }
      while (pAVar27 != (Atom *)0x0) {
        lVar36 = (long)(pAVar27->super_StuntDouble).localIndex_;
        lVar25 = *(long *)((long)&(((pAVar27->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                  atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                          (pAVar27->super_StuntDouble).storage_);
        pdVar30 = (double *)(lVar25 + lVar36 * 0x18);
        local_128.super_Vector<double,_3U>.data_[0] = *pdVar30;
        local_128.super_Vector<double,_3U>.data_[1] = pdVar30[1];
        local_128.super_Vector<double,_3U>.data_[2] = *(double *)(lVar25 + 0x10 + lVar36 * 0x18);
        Snapshot::wrapVector(this->info_->sman_->currentSnapshot_,&local_128);
        lVar25 = 0;
        do {
          local_148[lVar25] = (&local_e8)[lVar25] * local_128.super_Vector<double,_3U>.data_[lVar25]
          ;
          dVar41 = local_148[0];
          lVar25 = lVar25 + 1;
        } while (lVar25 != 3);
        local_228.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = 1.0;
        local_388.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = 1.0;
        local_3a8.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = 1.0;
        local_3c8.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = 0.0;
        local_3e8.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = 0.0;
        local_2e8.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = 0.0;
        local_490 = ppAVar28;
        dVar39 = cos(local_148[0]);
        dVar44 = local_148[1];
        local_228.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = dVar39;
        dVar40 = cos(local_148[1]);
        dVar39 = local_148[2];
        local_388.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = dVar40;
        dVar40 = cos(local_148[2]);
        local_3a8.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = dVar40;
        dVar41 = sin(dVar41);
        local_3c8.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = dVar41;
        dVar41 = sin(dVar44);
        local_3e8.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar36] = dVar41;
        dVar41 = sin(dVar39);
        local_4f0 = local_2e8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_4f0[lVar36] = dVar41;
        local_4b0 = local_228.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_3f0 = local_3c8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_400 = local_388.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_408 = local_3e8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_418 = local_3a8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        lVar25 = 0x48;
        do {
          lVar35 = *(long *)((long)&local_228.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar25);
          lVar11 = *(long *)((long)&local_3c8.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar25);
          *(double *)
           (*(long *)((long)&((local_228.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar25) + lVar36 * 8) =
               *(double *)(lVar35 + lVar36 * 8) * local_4b0[lVar36] -
               local_3f0[lVar36] * *(double *)(lVar11 + lVar36 * 8);
          lVar12 = *(long *)((long)&local_388.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar25);
          lVar13 = *(long *)((long)&local_3e8.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar25);
          *(double *)
           (*(long *)((long)&((local_388.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar25) + lVar36 * 8) =
               *(double *)(lVar12 + lVar36 * 8) * local_400[lVar36] -
               local_408[lVar36] * *(double *)(lVar13 + lVar36 * 8);
          lVar14 = *(long *)((long)&local_3a8.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar25);
          lVar15 = *(long *)((long)&local_2e8.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar25);
          *(double *)
           (*(long *)((long)&((local_3a8.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar25) + lVar36 * 8) =
               *(double *)(lVar14 + lVar36 * 8) * local_418[lVar36] -
               local_4f0[lVar36] * *(double *)(lVar15 + lVar36 * 8);
          *(double *)
           (*(long *)((long)&((local_3c8.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar25) + lVar36 * 8) =
               *(double *)(lVar11 + lVar36 * 8) * local_4b0[lVar36] +
               *(double *)(lVar35 + lVar36 * 8) * local_3f0[lVar36];
          *(double *)
           (*(long *)((long)&((local_3e8.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar25) + lVar36 * 8) =
               *(double *)(lVar13 + lVar36 * 8) * local_400[lVar36] +
               *(double *)(lVar12 + lVar36 * 8) * local_408[lVar36];
          *(double *)
           (*(long *)((long)&((local_2e8.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar25) + lVar36 * 8) =
               *(double *)(lVar15 + lVar36 * 8) * local_418[lVar36] +
               *(double *)(lVar14 + lVar36 * 8) * local_4f0[lVar36];
          lVar25 = lVar25 + 0x18;
        } while (lVar25 != 0xd8);
        ppAVar28 = local_490 + 1;
        this = local_2c0;
        local_4e0 = local_2e8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_4a8 = local_228.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_410 = local_3a8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_3f8 = local_388.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if (ppAVar28 ==
            (local_420->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pAVar27 = (Atom *)0x0;
        }
        else {
          pAVar27 = *ppAVar28;
        }
      }
      pMVar26 = SimInfo::nextMolecule(this->info_,&local_4f8);
    }
    dVar41 = 0.0;
    if (local_498 < 0.0) {
      dVar41 = exp(local_498 * local_4b8 * local_4b8);
    }
    sVar23 = local_2c8;
    dVar44 = 1.0;
    lVar25 = 1;
    do {
      dVar44 = dVar44 * dVar41;
      *(double *)((long)local_4a0 + lVar25 * 8) =
           (dVar44 * 332.0637778) / ((double)(int)lVar25 * local_4b8 * local_4b8);
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0x34);
    local_338 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_160,local_2c8,&local_338,(allocator_type *)local_468);
    local_338 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_178,sVar23,&local_338,(allocator_type *)local_468);
    local_338 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_350,sVar23,&local_338,(allocator_type *)local_468);
    local_338 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_368,sVar23,&local_338,(allocator_type *)local_468);
    local_338 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_240,sVar23,&local_338,(allocator_type *)local_468);
    local_338 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_258,sVar23,&local_338,(allocator_type *)local_468);
    local_338 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_270,sVar23,&local_338,(allocator_type *)local_468);
    local_338 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_288,sVar23,&local_338,(allocator_type *)local_468);
    local_338 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_2a0,sVar23,&local_338,(allocator_type *)local_468);
    local_338 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_2b8,sVar23,&local_338,(allocator_type *)local_468);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&local_190,sVar23,(value_type *)OpenMD::V3Zero,(allocator_type *)&local_338);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&local_1a8,sVar23,(value_type *)OpenMD::V3Zero,(allocator_type *)&local_338);
    local_478 = 0.0;
    local_488 = 0.0;
    pMStack_480 = (Molecule *)0x0;
    local_1e8[2] = 0.0;
    local_1e8[0] = 0.0;
    local_1e8[1] = 0.0;
    local_208[2] = 0.0;
    local_208[0] = 0.0;
    local_208[1] = 0.0;
    local_2f8 = 0;
    local_308 = 0;
    uStack_300 = 0;
    local_318 = 0;
    uStack_310 = 0;
    local_328 = 0.0;
    uStack_320 = 0;
    local_338 = 0.0;
    pvStack_330 = (pointer)0x0;
    local_4e0 = (pointer)(local_4e8 + local_4e8);
    local_4e8 = local_4e8 * 4.0;
    pdVar37 = (pointer)0x9;
    local_4f0 = (pointer)0x8;
    local_4b0 = (pointer)0x0;
    ppAVar28 = (pointer)0x1;
    do {
      lVar25 = (long)ppAVar28 + -1;
      local_4b8 = (double)(int)lVar25 * local_100;
      local_498 = (double)(lVar25 * lVar25);
      local_490 = ppAVar28;
      do {
        pMVar26 = SimInfo::beginMolecule(this->info_,&local_4f8);
        local_4a8 = (pointer)(local_4f0 + -1);
        iVar24 = (int)local_4a8;
        local_420 = (Molecule *)((double)iVar24 * local_f8);
        iVar32 = -iVar24;
        if (0 < iVar24) {
          iVar32 = iVar24;
        }
        while (pMVar26 != (Molecule *)0x0) {
          ppAVar28 = (pMVar26->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar16 = (pMVar26->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          if (ppAVar28 == ppAVar16) {
            pAVar27 = (Atom *)0x0;
          }
          else {
            pAVar27 = *ppAVar28;
          }
          if (pAVar27 != (Atom *)0x0) {
            do {
              ppAVar28 = ppAVar28 + 1;
              iVar24 = (pAVar27->super_StuntDouble).localIndex_;
              if (local_4f0 < (pointer)0x8) {
                pdVar17 = local_228.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)local_490].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar18 = local_3c8.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)local_490].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar19 = local_3e8.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar32 + 1U].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar20 = local_388.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar32 + 1U].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar24] =
                     pdVar17[iVar24] * pdVar20[iVar24] + pdVar18[iVar24] * pdVar19[iVar24];
                dVar41 = pdVar18[iVar24] * pdVar20[iVar24] - pdVar17[iVar24] * pdVar19[iVar24];
              }
              else {
                pdVar17 = local_228.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)local_490].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar18 = local_3c8.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)local_490].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar19 = local_3e8.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar32 + 1U].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar20 = local_388.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar32 + 1U].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar24] =
                     pdVar17[iVar24] * pdVar20[iVar24] - pdVar19[iVar24] * pdVar18[iVar24];
                dVar41 = pdVar18[iVar24] * pdVar20[iVar24] + pdVar19[iVar24] * pdVar17[iVar24];
              }
              local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar24] = dVar41;
              if (ppAVar28 == ppAVar16) {
                pAVar27 = (Atom *)0x0;
              }
              else {
                pAVar27 = *ppAVar28;
              }
            } while (pAVar27 != (Atom *)0x0);
          }
          pMVar26 = SimInfo::nextMolecule(this->info_,&local_4f8);
        }
        local_4a8 = (pointer)((long)local_4a8 * (long)local_4a8 + (long)local_498);
        do {
          pdVar17 = pdVar37 + -1;
          iVar24 = (int)pdVar17;
          iVar32 = -iVar24;
          if (0 < iVar24) {
            iVar32 = iVar24;
          }
          ppdVar31 = (pointer *)
                     ((long)&(local_4a8->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                     (long)pdVar17 * (long)pdVar17);
          if (ppdVar31 < (pointer *)0x34) {
            local_478 = (double)iVar24 * local_f0;
            local_488 = local_4b8;
            pMStack_480 = local_420;
            pMVar26 = SimInfo::beginMolecule(this->info_,&local_4f8);
            while (pMVar26 != (Molecule *)0x0) {
              ppAVar28 = (pMVar26->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              ppAVar16 = (pMVar26->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
              if (ppAVar28 == ppAVar16) {
                pAVar27 = (Atom *)0x0;
              }
              else {
                pAVar27 = *ppAVar28;
              }
              if (pAVar27 != (Atom *)0x0) {
                do {
                  ppAVar28 = ppAVar28 + 1;
                  iVar24 = (pAVar27->super_StuntDouble).localIndex_;
                  if (pdVar37 < (pointer)0x8) {
                    pdVar17 = local_2e8.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar32 + 1U].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    pdVar18 = local_3a8.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar32 + 1U].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    local_350.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar24] =
                         local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24] * pdVar18[iVar24] +
                         local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24] * pdVar17[iVar24];
                    dVar41 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar24] * pdVar18[iVar24] -
                             pdVar17[iVar24] *
                             local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar24];
                  }
                  else {
                    pdVar17 = local_2e8.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar32 + 1U].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    pdVar18 = local_3a8.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar32 + 1U].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    local_350.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar24] =
                         local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24] * pdVar18[iVar24] -
                         pdVar17[iVar24] *
                         local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24];
                    dVar41 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar24] * pdVar18[iVar24] +
                             local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar24] * pdVar17[iVar24];
                  }
                  local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar24] = dVar41;
                  if (ppAVar28 == ppAVar16) {
                    pAVar27 = (Atom *)0x0;
                  }
                  else {
                    pAVar27 = *ppAVar28;
                  }
                } while (pAVar27 != (Atom *)0x0);
              }
              pMVar26 = SimInfo::nextMolecule(this->info_,&local_4f8);
            }
            local_3f0 = pdVar37;
            pMVar26 = SimInfo::beginMolecule(this->info_,&local_4f8);
            while (pMVar26 != (Molecule *)0x0) {
              ppAVar28 = (pMVar26->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              while( true ) {
                if (ppAVar28 ==
                    (pMVar26->atoms_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  pAVar27 = (Atom *)0x0;
                }
                else {
                  pAVar27 = *ppAVar28;
                }
                if (pAVar27 == (Atom *)0x0) break;
                iVar32 = (pAVar27->super_StuntDouble).localIndex_;
                iVar24 = AtomType::getIdent(pAVar27->atomType_);
                pEVar21 = (this->ElectrostaticMap).
                          super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar24 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24];
                bVar8 = pEVar21[iVar24].is_Dipole;
                bVar9 = pEVar21[iVar24].is_Quadrupole;
                if ((pEVar21[iVar24].is_Charge & 1U) != 0) {
                  dVar41 = pEVar21[iVar24].fixedCharge;
                  if ((pEVar21[iVar24].is_Fluctuating & 1U) != 0) {
                    dVar41 = dVar41 + *(double *)
                                       (*(long *)((long)&(((pAVar27->super_StuntDouble).snapshotMan_
                                                          )->currentSnapshot_->atomData).flucQPos.
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                 (pAVar27->super_StuntDouble).storage_) +
                                       (long)(pAVar27->super_StuntDouble).localIndex_ * 8);
                  }
                  local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar32] =
                       local_350.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar32] * dVar41;
                  local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar32] =
                       dVar41 * local_368.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar32];
                }
                if ((bVar8 & 1U) != 0) {
                  lVar36 = (long)(pAVar27->super_StuntDouble).localIndex_;
                  lVar25 = *(long *)((long)&(((pAVar27->super_StuntDouble).snapshotMan_)->
                                             currentSnapshot_->atomData).dipole.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    (pAVar27->super_StuntDouble).storage_);
                  local_4d8[2] = *(double *)(lVar25 + 0x10 + lVar36 * 0x18);
                  pdVar30 = (double *)(lVar25 + lVar36 * 0x18);
                  local_4d8[0] = *pdVar30;
                  local_4d8[1] = pdVar30[1];
                  local_468[0] = 0.0;
                  local_468[1] = 0.0;
                  local_468[2] = 0.0;
                  lVar25 = 0;
                  do {
                    local_468[lVar25] = local_4d8[lVar25] * 0.20819434;
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != 3);
                  local_208[2] = local_468[2];
                  local_208[0] = local_468[0];
                  local_208[1] = local_468[1];
                  dVar41 = 0.0;
                  lVar25 = 0;
                  do {
                    dVar41 = dVar41 + local_208[lVar25] * (&local_488)[lVar25];
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != 3);
                  local_190.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar32].super_Vector<double,_3U>.data_
                  [0] = local_478 * local_468[1] - local_468[2] * (double)pMStack_480;
                  local_190.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar32].super_Vector<double,_3U>.data_
                  [1] = local_488 * local_468[2] - local_468[0] * local_478;
                  local_190.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar32].super_Vector<double,_3U>.data_
                  [2] = local_468[0] * (double)pMStack_480 - local_488 * local_468[1];
                  local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar32] =
                       local_350.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar32] * dVar41;
                  local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar32] =
                       dVar41 * local_368.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar32];
                }
                if ((bVar9 & 1U) != 0) {
                  __return_storage_ptr__ = (double (*) [3])local_468;
                  StuntDouble::getQuadrupole
                            ((Mat3x3d *)__return_storage_ptr__,&pAVar27->super_StuntDouble);
                  local_98 = 0;
                  uStack_90 = 0;
                  local_a8 = 0;
                  uStack_a0 = 0;
                  local_b8 = 0;
                  uStack_b0 = 0;
                  local_c8 = 0.0;
                  uStack_c0 = 0;
                  local_88 = 0;
                  pvVar29 = &local_c8;
                  lVar25 = 0;
                  do {
                    lVar36 = 0;
                    do {
                      pvVar29[lVar36] =
                           (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                           super_RectMatrix<double,_3U,_3U>).data_[0][lVar36] * 0.20819434;
                      lVar36 = lVar36 + 1;
                    } while (lVar36 != 3);
                    lVar25 = lVar25 + 1;
                    pvVar29 = pvVar29 + 3;
                    __return_storage_ptr__ = __return_storage_ptr__ + 1;
                  } while (lVar25 != 3);
                  pvVar29 = &local_338;
                  pvVar33 = &local_c8;
                  pvVar34 = pvVar29;
                  for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
                    *pvVar34 = *pvVar33;
                    pvVar33 = pvVar33 + (ulong)bVar38 * -2 + 1;
                    pvVar34 = pvVar34 + (ulong)bVar38 * -2 + 1;
                  }
                  local_468[0] = 0.0;
                  local_468[1] = 0.0;
                  local_468[2] = 0.0;
                  lVar25 = 0;
                  do {
                    dVar41 = local_468[lVar25];
                    lVar36 = 0;
                    do {
                      dVar41 = dVar41 + pvVar29[lVar36] * (&local_488)[lVar36];
                      lVar36 = lVar36 + 1;
                    } while (lVar36 != 3);
                    local_468[lVar25] = dVar41;
                    lVar25 = lVar25 + 1;
                    pvVar29 = pvVar29 + 3;
                  } while (lVar25 != 3);
                  local_1e8[2] = local_468[2];
                  local_1e8[0] = local_468[0];
                  local_1e8[1] = local_468[1];
                  dVar41 = 0.0;
                  lVar25 = 0;
                  do {
                    dVar41 = dVar41 + (&local_488)[lVar25] * local_1e8[lVar25];
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != 3);
                  dVar39 = local_488 * local_468[1];
                  dVar40 = local_468[0] * local_478;
                  dVar44 = local_468[0] * (double)pMStack_480;
                  local_468[0] = local_468[2] * (double)pMStack_480 - local_478 * local_468[1];
                  local_468[1] = dVar40 - local_488 * local_468[2];
                  local_468[2] = dVar39 - dVar44;
                  lVar25 = 0;
                  do {
                    local_468[lVar25] = -local_468[lVar25];
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != 3);
                  local_1a8.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar32].super_Vector<double,_3U>.data_
                  [2] = local_468[2];
                  local_1a8.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar32].super_Vector<double,_3U>.data_
                  [0] = local_468[0];
                  local_1a8.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar32].super_Vector<double,_3U>.data_
                  [1] = local_468[1];
                  local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar32] =
                       local_350.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar32] * dVar41;
                  local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar32] =
                       dVar41 * local_368.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar32];
                }
                ppAVar28 = ppAVar28 + 1;
              }
              pMVar26 = SimInfo::nextMolecule(this->info_,&local_4f8);
            }
            dVar44 = 0.0;
            dVar41 = 0.0;
            for (pdVar30 = local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar30 !=
                local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar30 = pdVar30 + 1) {
              dVar41 = dVar41 + *pdVar30;
            }
            if (local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              dVar44 = 0.0;
              pdVar37 = local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                dVar44 = dVar44 + *pdVar37;
                pdVar37 = pdVar37 + 1;
              } while (pdVar37 !=
                       local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            local_3f8 = (pointer)0x0;
            local_400 = (pointer)0x0;
            for (pdVar37 = local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar37 !=
                local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar37 = pdVar37 + 1) {
              local_400 = (pointer)((double)local_400 + *pdVar37);
            }
            if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_3f8 = (pointer)0x0;
              pdVar37 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                local_3f8 = (pointer)((double)local_3f8 + *pdVar37);
                pdVar37 = pdVar37 + 1;
              } while (pdVar37 !=
                       local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            local_410 = (pointer)0x0;
            local_408 = (pointer)0x0;
            for (pdVar37 = local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar37 !=
                local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar37 = pdVar37 + 1) {
              local_408 = (pointer)((double)local_408 + *pdVar37);
            }
            if (local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_410 = (pointer)0x0;
              pdVar37 = local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                local_410 = (pointer)((double)local_410 + *pdVar37);
                pdVar37 = pdVar37 + 1;
              } while (pdVar37 !=
                       local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            local_418 = (pointer)(*(double *)((long)local_4a0 + (long)ppdVar31 * 8) *
                                 (double)local_4e0);
            pMVar26 = SimInfo::beginMolecule(this->info_,&local_4f8);
            dVar44 = (dVar44 + (double)local_400) - (double)local_410;
            dVar41 = (dVar41 - (double)local_3f8) - (double)local_408;
            local_4b0 = (pointer)((double)local_4b0 +
                                 (double)local_418 * (dVar44 * dVar44 + dVar41 * dVar41));
            while (pdVar37 = local_3f0, pMVar26 != (Molecule *)0x0) {
              ppAVar28 = (pMVar26->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              while( true ) {
                if (ppAVar28 ==
                    (pMVar26->atoms_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  pAVar27 = (Atom *)0x0;
                }
                else {
                  pAVar27 = *ppAVar28;
                }
                if (pAVar27 == (Atom *)0x0) break;
                iVar32 = (pAVar27->super_StuntDouble).localIndex_;
                iVar24 = AtomType::getIdent(pAVar27->atomType_);
                pEVar21 = (this->ElectrostaticMap).
                          super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar24 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24];
                bVar8 = pEVar21[iVar24].is_Dipole;
                bVar9 = pEVar21[iVar24].is_Quadrupole;
                bVar10 = pEVar21[iVar24].is_Fluctuating;
                dVar39 = *(double *)((long)local_4a0 + (long)ppdVar31 * 8);
                dVar40 = local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar32];
                dVar1 = local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar32];
                dVar2 = local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar32];
                dVar3 = local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar32];
                dVar4 = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar32];
                dVar5 = local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar32];
                dVar6 = local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar32];
                dVar7 = local_350.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar32];
                local_4d8[0] = 0.0;
                local_4d8[1] = 0.0;
                local_4d8[2] = 0.0;
                lVar25 = 0;
                do {
                  local_4d8[lVar25] =
                       (&local_488)[lVar25] *
                       (((dVar40 + dVar1) - dVar2) * dVar41 - ((dVar3 - dVar4) - dVar5) * dVar44) *
                       dVar39 * local_4e8;
                  lVar25 = lVar25 + 1;
                } while (lVar25 != 3);
                local_468[2] = local_4d8[2];
                local_468[0] = local_4d8[0];
                local_468[1] = local_4d8[1];
                pSVar22 = ((pAVar27->super_StuntDouble).snapshotMan_)->currentSnapshot_;
                lVar25 = (long)(pAVar27->super_StuntDouble).localIndex_;
                lVar36 = lVar25 * 0x18 +
                         *(long *)((long)&(pSVar22->atomData).force.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (pAVar27->super_StuntDouble).storage_);
                lVar35 = 0;
                do {
                  *(double *)(lVar36 + lVar35 * 8) =
                       local_468[lVar35] + *(double *)(lVar36 + lVar35 * 8);
                  lVar35 = lVar35 + 1;
                } while (lVar35 != 3);
                dVar40 = (dVar39 + dVar39) * (dVar7 * dVar41 + dVar44 * dVar6);
                if ((bVar10 & 1U) != 0) {
                  lVar36 = *(long *)((long)&(pSVar22->atomData).flucQFrc.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                    (pAVar27->super_StuntDouble).storage_);
                  *(double *)(lVar36 + lVar25 * 8) =
                       *(double *)(lVar36 + lVar25 * 8) - (double)local_4e0 * dVar40;
                }
                if ((bVar8 & 1U) != 0) {
                  local_4d8[0] = 0.0;
                  local_4d8[1] = 0.0;
                  local_4d8[2] = 0.0;
                  lVar25 = 0;
                  do {
                    local_4d8[lVar25] =
                         local_190.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar32].super_Vector<double,_3U>.
                         data_[lVar25] * (dVar6 * dVar41 - dVar44 * dVar7) * dVar39 * local_4e8;
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != 3);
                  local_468[2] = local_4d8[2];
                  local_468[0] = local_4d8[0];
                  local_468[1] = local_4d8[1];
                  lVar25 = (long)(pAVar27->super_StuntDouble).localIndex_ * 0x18 +
                           *(long *)((long)&(((pAVar27->super_StuntDouble).snapshotMan_)->
                                             currentSnapshot_->atomData).torque.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    (pAVar27->super_StuntDouble).storage_);
                  lVar36 = 0;
                  do {
                    *(double *)(lVar25 + lVar36 * 8) =
                         local_468[lVar36] + *(double *)(lVar25 + lVar36 * 8);
                    lVar36 = lVar36 + 1;
                  } while (lVar36 != 3);
                }
                local_468[0] = local_4d8[0];
                local_468[1] = local_4d8[1];
                local_468[2] = local_4d8[2];
                if ((bVar9 & 1U) != 0) {
                  local_4d8[0] = 0.0;
                  local_4d8[1] = 0.0;
                  local_4d8[2] = 0.0;
                  lVar25 = 0;
                  do {
                    local_4d8[lVar25] =
                         local_1a8.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar32].super_Vector<double,_3U>.
                         data_[lVar25] * dVar40 * local_4e8;
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != 3);
                  local_468[2] = local_4d8[2];
                  local_468[0] = local_4d8[0];
                  local_468[1] = local_4d8[1];
                  lVar25 = (long)(pAVar27->super_StuntDouble).localIndex_ * 0x18 +
                           *(long *)((long)&(((pAVar27->super_StuntDouble).snapshotMan_)->
                                             currentSnapshot_->atomData).torque.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    (pAVar27->super_StuntDouble).storage_);
                  lVar36 = 0;
                  do {
                    *(double *)(lVar25 + lVar36 * 8) =
                         local_468[lVar36] + *(double *)(lVar25 + lVar36 * 8);
                    lVar36 = lVar36 + 1;
                  } while (lVar36 != 3);
                }
                ppAVar28 = ppAVar28 + 1;
                local_4d8[0] = local_468[0];
                local_4d8[1] = local_468[1];
                local_4d8[2] = local_468[2];
              }
              pMVar26 = SimInfo::nextMolecule(this->info_,&local_4f8);
            }
          }
          pdVar37 = (pointer)((long)pdVar37 + 1);
        } while (pdVar37 != (pointer)0x10);
        local_4f0 = (pointer)((long)local_4f0 + 1);
        pdVar37 = (pointer)0x1;
      } while (local_4f0 != (pointer)0x10);
      ppAVar28 = (pointer)((long)local_490 + 1);
      local_4f0 = (pointer)0x1;
    } while (ppAVar28 != (pointer)0x9);
    *local_108 = (double)local_4b0 + *local_108;
    if (local_1a8.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a8.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_190.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_190.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_190.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_368.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_350.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_350.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_350.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_350.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2e8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_3e8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_3c8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_3a8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_388);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_228);
    __s = local_4a0;
  }
  operator_delete(__s,0x1a0);
  return;
}

Assistant:

void Electrostatic::ReciprocalSpaceSum(RealType& pot) {
    RealType kPot = 0.0;
    RealType kVir = 0.0;
    // Mat3x3d kVirTens(0.0);

    const RealType mPoleConverter = 0.20819434;  // converts from the
                                                 // internal units of
                                                 // Debye (for dipoles)
                                                 // or Debye-angstroms
                                                 // (for quadrupoles) to
                                                 // electron angstroms or
                                                 // electron-angstroms^2

    const RealType eConverter = 332.0637778;  // convert the
                                              // Charge-Charge
                                              // electrostatic
                                              // interactions into kcal /
                                              // mol assuming distances
                                              // are measured in
                                              // angstroms.

    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    Vector3d box = hmat.diagonals();
    RealType boxMax = box.max();

    // int kMax = int(2.0 * Constants::PI / (pow(dampingAlpha_,2)*cutoffRadius_
    // * boxMax) );
    int kMax   = 7;
    int kSqMax = kMax * kMax + 2;

    int kLimit = kMax + 1;
    int kLim2  = 2 * kMax + 1;
    int kSqLim = kSqMax;

    vector<RealType> AK(kSqLim + 1, 0.0);
    RealType xcl  = 2.0 * Constants::PI / box.x();
    RealType ycl  = 2.0 * Constants::PI / box.y();
    RealType zcl  = 2.0 * Constants::PI / box.z();
    RealType rcl  = 2.0 * Constants::PI / boxMax;
    RealType rvol = 2.0 * Constants::PI / (box.x() * box.y() * box.z());

    if (dampingAlpha_ < 1.0e-12) return;

    RealType ralph = -0.25 / pow(dampingAlpha_, 2);

    // Calculate and store exponential factors

    vector<vector<RealType>> elc;
    vector<vector<RealType>> emc;
    vector<vector<RealType>> enc;
    vector<vector<RealType>> els;
    vector<vector<RealType>> ems;
    vector<vector<RealType>> ens;

    int nMax = info_->getNAtoms();

    elc.resize(kLimit + 1);
    emc.resize(kLimit + 1);
    enc.resize(kLimit + 1);
    els.resize(kLimit + 1);
    ems.resize(kLimit + 1);
    ens.resize(kLimit + 1);

    for (int j = 0; j < kLimit + 1; j++) {
      elc[j].resize(nMax);
      emc[j].resize(nMax);
      enc[j].resize(nMax);
      els[j].resize(nMax);
      ems[j].resize(nMax);
      ens[j].resize(nMax);
    }

    Vector3d t(2.0 * Constants::PI);
    t.Vdiv(t, box);

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    int i;
    Vector3d r;
    Vector3d tt;

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        i = atom->getLocalIndex();
        r = atom->getPos();
        info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

        tt.Vmul(t, r);

        elc[1][i] = 1.0;
        emc[1][i] = 1.0;
        enc[1][i] = 1.0;
        els[1][i] = 0.0;
        ems[1][i] = 0.0;
        ens[1][i] = 0.0;

        elc[2][i] = cos(tt.x());
        emc[2][i] = cos(tt.y());
        enc[2][i] = cos(tt.z());
        els[2][i] = sin(tt.x());
        ems[2][i] = sin(tt.y());
        ens[2][i] = sin(tt.z());

        for (int l = 3; l <= kLimit; l++) {
          elc[l][i] = elc[l - 1][i] * elc[2][i] - els[l - 1][i] * els[2][i];
          emc[l][i] = emc[l - 1][i] * emc[2][i] - ems[l - 1][i] * ems[2][i];
          enc[l][i] = enc[l - 1][i] * enc[2][i] - ens[l - 1][i] * ens[2][i];
          els[l][i] = els[l - 1][i] * elc[2][i] + elc[l - 1][i] * els[2][i];
          ems[l][i] = ems[l - 1][i] * emc[2][i] + emc[l - 1][i] * ems[2][i];
          ens[l][i] = ens[l - 1][i] * enc[2][i] + enc[l - 1][i] * ens[2][i];
        }
      }
    }

    // Calculate and store AK coefficients:

    RealType eksq = 1.0;
    RealType expf = 0.0;
    if (ralph < 0.0) expf = exp(ralph * rcl * rcl);
    for (i = 1; i <= kSqLim; i++) {
      RealType rksq = float(i) * rcl * rcl;
      eksq          = expf * eksq;
      AK[i]         = eConverter * eksq / rksq;
    }

    /*
     * Loop over all k vectors k = 2 pi (ll/Lx, mm/Ly, nn/Lz)
     * the values of ll, mm and nn are selected so that the symmetry of
     * reciprocal lattice is taken into account i.e. the following
     * rules apply.
     *
     * ll ranges over the values 0 to kMax only.
     *
     * mm ranges over 0 to kMax when ll=0 and over
     *            -kMax to kMax otherwise.
     * nn ranges over 1 to kMax when ll=mm=0 and over
     *            -kMax to kMax otherwise.
     *
     * Hence the result of the summation must be doubled at the end.
     */

    std::vector<RealType> clm(nMax, 0.0);
    std::vector<RealType> slm(nMax, 0.0);
    std::vector<RealType> ckr(nMax, 0.0);
    std::vector<RealType> skr(nMax, 0.0);
    std::vector<RealType> ckc(nMax, 0.0);
    std::vector<RealType> cks(nMax, 0.0);
    std::vector<RealType> dkc(nMax, 0.0);
    std::vector<RealType> dks(nMax, 0.0);
    std::vector<RealType> qkc(nMax, 0.0);
    std::vector<RealType> qks(nMax, 0.0);
    std::vector<Vector3d> dxk(nMax, V3Zero);
    std::vector<Vector3d> qxk(nMax, V3Zero);
    RealType rl, rm, rn;
    Vector3d kVec;
    Vector3d Qk;
    // RealType k2;
    Mat3x3d Kmat;
    RealType ckcs, ckss, dkcs, dkss, qkcs, qkss;
    int atid;
    ElectrostaticAtomData data;
    RealType C, dk, qk;
    Vector3d D;
    Mat3x3d Q;

    int mMin = kLimit;
    int nMin = kLimit + 1;
    for (int l = 1; l <= kLimit; l++) {
      int ll = l - 1;
      rl     = xcl * float(ll);
      for (int mmm = mMin; mmm <= kLim2; mmm++) {
        int mm = mmm - kLimit;
        int m  = abs(mm) + 1;
        rm     = ycl * float(mm);
        // Set temporary products of exponential terms
        for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
             mol           = info_->nextMolecule(mi)) {
          for (Atom* atom = mol->beginAtom(ai); atom != NULL;
               atom       = mol->nextAtom(ai)) {
            i = atom->getLocalIndex();
            if (mm < 0) {
              clm[i] = elc[l][i] * emc[m][i] + els[l][i] * ems[m][i];
              slm[i] = els[l][i] * emc[m][i] - ems[m][i] * elc[l][i];
            } else {
              clm[i] = elc[l][i] * emc[m][i] - els[l][i] * ems[m][i];
              slm[i] = els[l][i] * emc[m][i] + ems[m][i] * elc[l][i];
            }
          }
        }
        for (int nnn = nMin; nnn <= kLim2; nnn++) {
          int nn = nnn - kLimit;
          int n  = abs(nn) + 1;
          rn     = zcl * float(nn);
          // Test on magnitude of k vector:
          int kk = ll * ll + mm * mm + nn * nn;
          if (kk <= kSqLim) {
            kVec = Vector3d(rl, rm, rn);
            // k2     = dot(kVec, kVec);  // length^2 of kVec
            Kmat = outProduct(kVec, kVec);  // kMatrix
            // Calculate exp(ikr) terms
            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i = atom->getLocalIndex();

                if (nn < 0) {
                  ckr[i] = clm[i] * enc[n][i] + slm[i] * ens[n][i];
                  skr[i] = slm[i] * enc[n][i] - clm[i] * ens[n][i];

                } else {
                  ckr[i] = clm[i] * enc[n][i] - slm[i] * ens[n][i];
                  skr[i] = slm[i] * enc[n][i] + clm[i] * ens[n][i];
                }
              }
            }

            // Calculate scalar and vector products for each site:

            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i        = atom->getLocalIndex();
                int atid = atom->getAtomType()->getIdent();
                data     = ElectrostaticMap[Etids[atid]];

                if (data.is_Charge) {
                  C = data.fixedCharge;
                  if (data.is_Fluctuating) C += atom->getFlucQPos();
                  ckc[i] = C * ckr[i];
                  cks[i] = C * skr[i];
                }

                if (data.is_Dipole) {
                  D      = atom->getDipole() * mPoleConverter;
                  dk     = dot(D, kVec);
                  dxk[i] = cross(D, kVec);
                  dkc[i] = dk * ckr[i];
                  dks[i] = dk * skr[i];
                }
                if (data.is_Quadrupole) {
                  Q      = atom->getQuadrupole() * mPoleConverter;
                  Qk     = Q * kVec;
                  qk     = dot(kVec, Qk);
                  qxk[i] = -cross(kVec, Qk);
                  qkc[i] = qk * ckr[i];
                  qks[i] = qk * skr[i];
                }
              }
            }

            // calculate vector sums

            ckcs = std::accumulate(ckc.begin(), ckc.end(), 0.0);
            ckss = std::accumulate(cks.begin(), cks.end(), 0.0);
            dkcs = std::accumulate(dkc.begin(), dkc.end(), 0.0);
            dkss = std::accumulate(dks.begin(), dks.end(), 0.0);
            qkcs = std::accumulate(qkc.begin(), qkc.end(), 0.0);
            qkss = std::accumulate(qks.begin(), qks.end(), 0.0);

#ifdef IS_MPI
            MPI_Allreduce(MPI_IN_PLACE, &ckcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &ckss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &dkcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &dkss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &qkcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &qkss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
#endif

            // Accumulate potential energy and virial contribution:

            kPot += 2.0 * rvol * AK[kk] *
                    ((ckss + dkcs - qkss) * (ckss + dkcs - qkss) +
                     (ckcs - dkss - qkcs) * (ckcs - dkss - qkcs));

            kVir +=
                2.0 * rvol * AK[kk] *
                (ckcs * ckcs + ckss * ckss + 4.0 * (ckss * dkcs - ckcs * dkss) +
                 3.0 * (dkcs * dkcs + dkss * dkss) -
                 6.0 * (ckss * qkss + ckcs * qkcs) +
                 8.0 * (dkss * qkcs - dkcs * qkss) +
                 5.0 * (qkss * qkss + qkcs * qkcs));

            // kVirTens += 2 * rvol * AK[kk] *
            //   ( Mat3x3d::identity() - 2.0*( 1.0 / k2 - ralph) * Kmat ) *
            //   (ckcs * ckcs + ckss * ckss + 4.0 * (ckss * dkcs - ckcs * dkss)
            //   +
            //    3.0 * (dkcs * dkcs + dkss * dkss) -
            //    6.0 * (ckss * qkss + ckcs * qkcs) +
            //    8.0 * (dkss * qkcs - dkcs * qkss) +
            //    5.0 * (qkss * qkss + qkcs * qkcs));

            // Calculate force and torque for each site:

            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i    = atom->getLocalIndex();
                atid = atom->getAtomType()->getIdent();
                data = ElectrostaticMap[Etids[atid]];

                RealType qfrc =
                    AK[kk] *
                    ((cks[i] + dkc[i] - qks[i]) * (ckcs - dkss - qkcs) -
                     (ckc[i] - dks[i] - qkc[i]) * (ckss + dkcs - qkss));
                RealType qtrq1 = AK[kk] * (skr[i] * (ckcs - dkss - qkcs) -
                                           ckr[i] * (ckss + dkcs - qkss));
                RealType qtrq2 = 2.0 * AK[kk] *
                                 (ckr[i] * (ckcs - dkss - qkcs) +
                                  skr[i] * (ckss + dkcs - qkss));

                atom->addFrc(4.0 * rvol * qfrc * kVec);

                if (data.is_Fluctuating) {
                  atom->addFlucQFrc(-2.0 * rvol * qtrq2);
                }

                if (data.is_Dipole) {
                  atom->addTrq(4.0 * rvol * qtrq1 * dxk[i]);
                }
                if (data.is_Quadrupole) {
                  atom->addTrq(4.0 * rvol * qtrq2 * qxk[i]);
                }
              }
            }
          }
        }
        nMin = 1;
      }
      mMin = 1;
    }
    pot += kPot;
    //    virialTensor += kVirTens;
  }